

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Iterator * __thiscall kj::_::BTreeImpl::Iterator::operator++(Iterator *this)

{
  bool bVar1;
  Iterator *this_local;
  
  bVar1 = MaybeUint::operator==(this->leaf->rows + this->row,(void *)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this->row = this->row + 1;
    if (((0xd < this->row) ||
        (bVar1 = MaybeUint::operator==(this->leaf->rows + this->row,(void *)0x0), bVar1)) &&
       (this->leaf->next != 0)) {
      this->leaf = (Leaf *)(this->tree + this->leaf->next);
      this->row = 0;
    }
    return this;
  }
  inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h"
             ,0x559,"leaf->rows[row] != nullptr","\"B-tree iterator overflow\"",
             "B-tree iterator overflow");
}

Assistant:

inline Iterator& operator++() {
    KJ_TABLE_IREQUIRE(leaf->rows[row] != nullptr, "B-tree iterator overflow");
    ++row;
    if (row >= Leaf::NROWS || leaf->rows[row] == nullptr) {
      if (leaf->next == 0) {
        // at end; stay on current leaf
      } else {
        leaf = &tree[leaf->next].leaf;
        row = 0;
      }
    }
    return *this;
  }